

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector3T.h
# Opt level: O0

double * __thiscall
CD_Matrix::Vector3T<double,_false>::operator[](Vector3T<double,_false> *this,uint i)

{
  Vector3T<double,_false> *local_30;
  Vector3T<double,_false> *local_28;
  uint i_local;
  Vector3T<double,_false> *this_local;
  
  Norm<double,_false>::outdateNorm((Norm<double,_false> *)this);
  local_28 = this;
  if (i != 0) {
    if (i == 1) {
      local_30 = (Vector3T<double,_false> *)&this->m_y;
    }
    else {
      local_30 = (Vector3T<double,_false> *)&this->m_z;
    }
    local_28 = local_30;
  }
  return &local_28->m_x;
}

Assistant:

inline T & operator[](unsigned i)
  {
    Norm<T, normOptimization>::outdateNorm();
    return ((i == 0) ? m_x : (i == 1) ? m_y : m_z);
  }